

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O2

void __thiscall
gl4cts::TextureFilterMinmaxUtils::Texture1DArray::generate
          (Texture1DArray *this,RenderContext *context,IVec3 *size,GLenum format,GLenum type,
          bool generateMipmaps)

{
  undefined1 auVar1 [16];
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  Texture1DArray *this_00;
  MovePtr<glu::Texture1DArray,_de::DefaultDeleter<glu::Texture1DArray>_> *this_01;
  ulong in_stack_ffffffffffffffa0;
  Vec4 local_48;
  long lVar4;
  
  iVar2 = (*context->_vptr_RenderContext[3])(context);
  lVar4 = CONCAT44(extraout_var,iVar2);
  this_00 = (Texture1DArray *)operator_new(0x68);
  glu::Texture1DArray::Texture1DArray(this_00,context,format,type,size->m_data[0],2);
  this_01 = &this->m_texture;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_stack_ffffffffffffffa0;
  de::details::UniqueBase<glu::Texture1DArray,_de::DefaultDeleter<glu::Texture1DArray>_>::assignData
            (&this_01->
              super_UniqueBase<glu::Texture1DArray,_de::DefaultDeleter<glu::Texture1DArray>_>,
             (PtrData<glu::Texture1DArray,_de::DefaultDeleter<glu::Texture1DArray>_>)
             (auVar1 << 0x40));
  de::details::UniqueBase<glu::Texture1DArray,_de::DefaultDeleter<glu::Texture1DArray>_>::
  ~UniqueBase((UniqueBase<glu::Texture1DArray,_de::DefaultDeleter<glu::Texture1DArray>_> *)
              &stack0xffffffffffffff98);
  tcu::Texture1DArray::allocLevel
            (&((this_01->
               super_UniqueBase<glu::Texture1DArray,_de::DefaultDeleter<glu::Texture1DArray>_>).
               m_data.ptr)->m_refTexture,0);
  tcu::Texture1DArray::allocLevel
            (&((this_01->
               super_UniqueBase<glu::Texture1DArray,_de::DefaultDeleter<glu::Texture1DArray>_>).
               m_data.ptr)->m_refTexture,1);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glu::Texture1DArray error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x114);
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 0.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[3] = 1.0;
  tcu::fillWithGrid((((this_01->
                      super_UniqueBase<glu::Texture1DArray,_de::DefaultDeleter<glu::Texture1DArray>_>
                      ).m_data.ptr)->m_refTexture).super_TextureLevelPyramid.m_access.
                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,4,(Vec4 *)&stack0xffffffffffffff98,
                    &local_48);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glu::Texture1DArray error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x118);
  local_48.m_data[0] = 1.0;
  local_48.m_data[1] = 0.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[3] = 1.0;
  tcu::fillWithGrid((PixelBufferAccess *)
                    ((long)(((this_01->
                             super_UniqueBase<glu::Texture1DArray,_de::DefaultDeleter<glu::Texture1DArray>_>
                             ).m_data.ptr)->m_refTexture).super_TextureLevelPyramid.m_access.
                           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                           ._M_impl.super__Vector_impl_data._M_start + 0x28),4,
                    (Vec4 *)&stack0xffffffffffffff98,&local_48);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glu::Texture1DArray error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x11c);
  glu::Texture1DArray::upload
            ((this_01->
             super_UniqueBase<glu::Texture1DArray,_de::DefaultDeleter<glu::Texture1DArray>_>).m_data
             .ptr);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glu::Texture1DArray error occurred",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                  ,0x11f);
  (**(code **)(lVar4 + 8))(0x84c0);
  return;
}

Assistant:

void TextureFilterMinmaxUtils::Texture1DArray::generate(const glu::RenderContext& context, tcu::IVec3 size,
														glw::GLenum format, glw::GLenum type, bool generateMipmaps)
{
	DE_UNREF(generateMipmaps);

	const glw::Functions& gl = context.getFunctions();

	m_texture = de::MovePtr<glu::Texture1DArray>(new glu::Texture1DArray(context, format, type, size.x(), 2));

	m_texture->getRefTexture().allocLevel(0);
	m_texture->getRefTexture().allocLevel(1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture1DArray error occurred");

	tcu::fillWithGrid(m_texture->getRefTexture().getLevel(0), 4, tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
					  tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture1DArray error occurred");

	tcu::fillWithGrid(m_texture->getRefTexture().getLevel(1), 4, tcu::Vec4(0.0f, 1.0f, 1.0f, 1.0f),
					  tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture1DArray error occurred");

	m_texture->upload();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glu::Texture1DArray error occurred");

	gl.activeTexture(GL_TEXTURE0);
}